

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

void testutil_random_fe_non_zero(secp256k1_fe *nz)

{
  int iVar1;
  secp256k1_fe *in_stack_00000010;
  
  do {
    testutil_random_fe(in_stack_00000010);
    iVar1 = secp256k1_fe_is_zero((secp256k1_fe *)0x125cc7);
  } while (iVar1 != 0);
  return;
}

Assistant:

static void testutil_random_fe_non_zero(secp256k1_fe *nz) {
    do {
        testutil_random_fe(nz);
    } while (secp256k1_fe_is_zero(nz));
}